

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderStream.cpp
# Opt level: O2

SenderFlow * __thiscall
SenderStream::create_flow(SenderStream *this,string *name,string *bind,int port)

{
  SenderFlow *this_00;
  mapped_type *ppSVar1;
  string sStack_68;
  string local_48;
  
  this_00 = (SenderFlow *)operator_new(0x38);
  std::__cxx11::string::string((string *)&sStack_68,(string *)bind);
  SenderFlow::SenderFlow(this_00,&sStack_68,port);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  SenderFlow::set_name(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  ppSVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SenderFlow_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SenderFlow_*>_>_>
            ::operator[](&this->m_flows,name);
  *ppSVar1 = this_00;
  return this_00;
}

Assistant:

SenderFlow * SenderStream::create_flow(std::string name, std::string bind, int port)
{
    SenderFlow * flow = new SenderFlow(bind, port);
    flow->set_name(name);
    m_flows[name] = flow;
    return flow;
}